

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O0

void __thiscall EchoServer::onConnection(EchoServer *this,TcpConnectionPtr *conn)

{
  bool bVar1;
  LogLevel LVar2;
  LogStream *this_00;
  element_type *peVar3;
  self *psVar4;
  char *str;
  SourceFile file;
  InetAddress local_1048;
  InetAddress local_1018;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18
  ;
  TcpConnectionPtr *conn_local;
  EchoServer *this_local;
  
  local_18 = (__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)conn;
  conn_local = (TcpConnectionPtr *)this;
  LVar2 = sznet::Logger::logLevel();
  if ((int)LVar2 < 1) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_ff8,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/tcp_echo/tcp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    sznet::Logger::Logger(&local_fe8,file,0x41,TRACE,"onConnection");
    this_00 = sznet::Logger::stream(&local_fe8);
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    sznet::net::TcpConnection::peerAddress(peVar3);
    sznet::net::InetAddress::toIpPort_abi_cxx11_(&local_1018);
    psVar4 = sznet::LogStream::operator<<(this_00,(string *)&local_1018);
    psVar4 = sznet::LogStream::operator<<(psVar4," -> ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    sznet::net::TcpConnection::localAddress(peVar3);
    sznet::net::InetAddress::toIpPort_abi_cxx11_(&local_1048);
    psVar4 = sznet::LogStream::operator<<(psVar4,(string *)&local_1048);
    psVar4 = sznet::LogStream::operator<<(psVar4," is ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    bVar1 = sznet::net::TcpConnection::connected(peVar3);
    str = "DOWN";
    if (bVar1) {
      str = "UP";
    }
    sznet::LogStream::operator<<(psVar4,str);
    std::__cxx11::string::~string((string *)&local_1048);
    std::__cxx11::string::~string((string *)&local_1018);
    sznet::Logger::~Logger(&local_fe8);
  }
  peVar3 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  sznet::net::TcpConnection::setTcpNoDelay(peVar3,true);
  return;
}

Assistant:

void onConnection(const TcpConnectionPtr& conn)
    {
        LOG_TRACE << conn->peerAddress().toIpPort() << " -> "
            << conn->localAddress().toIpPort() << " is "
            << (conn->connected() ? "UP" : "DOWN");
        conn->setTcpNoDelay(true);
    }